

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O0

void iadst16_stage5_ssse3(__m128i *x)

{
  undefined1 (*in_RDI) [16];
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  __m128i _in1_3;
  __m128i _in0_3;
  __m128i _in1_2;
  __m128i _in0_2;
  __m128i _in1_1;
  __m128i _in0_1;
  __m128i _in1;
  __m128i _in0;
  __m128i _in1_7;
  __m128i _in0_7;
  __m128i _in1_6;
  __m128i _in0_6;
  __m128i _in1_5;
  __m128i _in0_5;
  __m128i _in1_4;
  __m128i _in0_4;
  
  auVar2 = *in_RDI;
  auVar1 = paddsw(*in_RDI,in_RDI[4]);
  *in_RDI = auVar1;
  auVar2 = psubsw(auVar2,in_RDI[4]);
  in_RDI[4] = auVar2;
  auVar2 = in_RDI[1];
  auVar1 = paddsw(in_RDI[1],in_RDI[5]);
  in_RDI[1] = auVar1;
  auVar2 = psubsw(auVar2,in_RDI[5]);
  in_RDI[5] = auVar2;
  auVar2 = in_RDI[2];
  auVar1 = paddsw(in_RDI[2],in_RDI[6]);
  in_RDI[2] = auVar1;
  auVar2 = psubsw(auVar2,in_RDI[6]);
  in_RDI[6] = auVar2;
  auVar2 = in_RDI[3];
  auVar1 = paddsw(in_RDI[3],in_RDI[7]);
  in_RDI[3] = auVar1;
  auVar2 = psubsw(auVar2,in_RDI[7]);
  in_RDI[7] = auVar2;
  auVar2 = in_RDI[8];
  auVar1 = paddsw(in_RDI[8],in_RDI[0xc]);
  in_RDI[8] = auVar1;
  auVar2 = psubsw(auVar2,in_RDI[0xc]);
  in_RDI[0xc] = auVar2;
  auVar2 = in_RDI[9];
  auVar1 = paddsw(in_RDI[9],in_RDI[0xd]);
  in_RDI[9] = auVar1;
  auVar2 = psubsw(auVar2,in_RDI[0xd]);
  in_RDI[0xd] = auVar2;
  auVar2 = in_RDI[10];
  auVar1 = paddsw(in_RDI[10],in_RDI[0xe]);
  in_RDI[10] = auVar1;
  auVar2 = psubsw(auVar2,in_RDI[0xe]);
  in_RDI[0xe] = auVar2;
  auVar2 = in_RDI[0xb];
  auVar1 = paddsw(in_RDI[0xb],in_RDI[0xf]);
  in_RDI[0xb] = auVar1;
  auVar2 = psubsw(auVar2,in_RDI[0xf]);
  in_RDI[0xf] = auVar2;
  return;
}

Assistant:

static inline void iadst16_stage5_ssse3(__m128i *x) {
  btf_16_adds_subs_sse2(x[0], x[4]);
  btf_16_adds_subs_sse2(x[1], x[5]);
  btf_16_adds_subs_sse2(x[2], x[6]);
  btf_16_adds_subs_sse2(x[3], x[7]);
  btf_16_adds_subs_sse2(x[8], x[12]);
  btf_16_adds_subs_sse2(x[9], x[13]);
  btf_16_adds_subs_sse2(x[10], x[14]);
  btf_16_adds_subs_sse2(x[11], x[15]);
}